

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_run_compression_cpp(bool copy_on_write)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  uint32_t i;
  uint32_t x;
  Roaring r1;
  
  roaring::Roaring::Roaring(&r1);
  r1.roaring.high_low_container.flags = r1.roaring.high_low_container.flags & 0xfe | copy_on_write;
  for (x = 100; x != 0x2711; x = x + 1) {
    roaring::Roaring::add(&r1,x);
  }
  sVar2 = roaring::Roaring::getSizeInBytes(&r1,true);
  bVar1 = roaring::Roaring::runOptimize(&r1);
  sVar3 = roaring::Roaring::getSizeInBytes(&r1,true);
  _assert_true((ulong)bVar1,"has_run",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,499);
  _assert_true((ulong)(sVar3 < sVar2),"size_origin > size_optimized",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,500);
  bVar1 = roaring::Roaring::removeRunCompression(&r1);
  _assert_true((ulong)bVar1,"removed",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1f6);
  sVar2 = roaring::Roaring::getSizeInBytes(&r1,true);
  _assert_true((ulong)(sVar3 < sVar2),"size_removed > size_optimized",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1f8);
  roaring::Roaring::~Roaring(&r1);
  return;
}

Assistant:

void test_run_compression_cpp(bool copy_on_write) {
    Roaring r1;
    r1.setCopyOnWrite(copy_on_write);
    for (uint32_t i = 100; i <= 10000; i++) {
        r1.add(i);
    }
    uint64_t size_origin = r1.getSizeInBytes();
    bool has_run = r1.runOptimize();
    uint64_t size_optimized = r1.getSizeInBytes();
    assert_true(has_run);
    assert_true(size_origin > size_optimized);
    bool removed = r1.removeRunCompression();
    assert_true(removed);
    uint64_t size_removed = r1.getSizeInBytes();
    assert_true(size_removed > size_optimized);
    return;
}